

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

void __thiscall Kernel::Inference::initMany(Inference *this,InferenceRule r,UnitList *premises)

{
  List<Kernel::Unit_*> **ppLVar1;
  ulong uVar2;
  Unit *pUVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  undefined7 in_register_00000031;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  List<Kernel::Unit_*> *pLVar13;
  bool bVar14;
  bool bVar15;
  
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xc0000000;
  this->_splits = (SplitSet *)0x0;
  this->_age = 0;
  *(ulong *)this =
       (ulong)(uint)((int)CONCAT71(in_register_00000031,r) << 8) |
       *(ulong *)this & 0xfffff800fc1e00e0 | 0xff00000001;
  this->_ptr1 = premises;
  this->_ptr2 = (void *)0x0;
  pLVar13 = premises;
  if (premises == (UnitList *)0x0) {
    computeTheoryRunningSums(this);
  }
  else {
    do {
      Unit::incRefCnt(pLVar13->_head);
      ppLVar1 = &pLVar13->_tail;
      pLVar13 = *ppLVar1;
    } while (*ppLVar1 != (List<Kernel::Unit_*> *)0x0);
    computeTheoryRunningSums(this);
    if (premises != (UnitList *)0x0) {
      uVar6 = *(ulong *)this | 0x1e0000;
      *(ulong *)this = uVar6;
      do {
        pUVar3 = premises->_head;
        uVar5 = (uint)uVar6;
        bVar7 = (byte)((uVar6 & 0xffffffff) >> 2) & 7;
        bVar8 = *(byte *)&pUVar3->_inference >> 2 & 7;
        if (bVar8 < bVar7) {
          bVar8 = bVar7;
        }
        uVar2 = (uVar6 & 0xffffffffffffffe3) + (ulong)bVar8 * 4;
        *(ulong *)this = uVar2;
        uVar9 = (ulong)(*(uint *)&pUVar3->_inference & uVar5 & 0x20000);
        *(ulong *)this = uVar2 & 0xfffffffffffdffff | uVar9;
        uVar10 = (ulong)(*(uint *)&pUVar3->_inference & uVar5 & 0x40000);
        *(ulong *)this = uVar2 & 0xfffffffffff9ffff | uVar9 | uVar10;
        uVar11 = (ulong)(*(uint *)&pUVar3->_inference & uVar5 & 0x80000);
        *(ulong *)this = uVar2 & 0xfffffffffff1ffff | uVar9 | uVar10 | uVar11;
        uVar12 = (ulong)(*(uint *)&pUVar3->_inference & uVar5 & 0x100000);
        *(ulong *)this = uVar2 & 0xffffffffffe1ffff | uVar9 | uVar10 | uVar11 | uVar12;
        bVar7 = (byte)*(undefined4 *)&(pUVar3->_inference).field_0x4;
        bVar8 = (byte)(uVar6 >> 0x20);
        if (bVar7 < bVar8) {
          bVar8 = bVar7;
        }
        uVar6 = uVar2 & 0xffffff00ffe1ffff | uVar9 | uVar10 | uVar11 | uVar12 | (ulong)bVar8 << 0x20
        ;
        *(ulong *)this = uVar6;
        premises = premises->_tail;
      } while (premises != (List<Kernel::Unit_*> *)0x0);
      goto LAB_00526d80;
    }
  }
  uVar6 = *(ulong *)this;
  cVar4 = (char)(uVar6 >> 8);
  bVar15 = ((uint)uVar6 & 0xff00) == 0xd400;
  bVar14 = (byte)(cVar4 + 0x2aU) < 8;
  *(ulong *)this =
       (ulong)bVar15 << 0x12 | uVar6 & 0xffffffffffe1ffff | (ulong)bVar14 << 0x13 |
       (ulong)(cVar4 == -0x21 || (byte)(cVar4 + 0x60U) < 0x3e) << 0x11 |
       (ulong)(bVar14 || bVar15) << 0x14;
LAB_00526d80:
  updateStatistics(this);
  return;
}

Assistant:

void Inference::initMany(InferenceRule r, UnitList* premises)
{
  initDefault(UnitInputType::AXIOM /* the minimal element; we later compute maximum over premises*/,r);

  _kind = Kind::INFERENCE_MANY;
  _ptr1 = premises;
  _ptr2 = nullptr;

  UnitList* it= premises;
  while(it) {
    it->head()->incRefCnt();
    it=it->tail();
  }

  computeTheoryRunningSums();

  if (premises) {
    _isPureTheoryDescendant = true;
    _combAxiomsDescendant = true;
    _proxyAxiomsDescendant = true;
    _holAxiomsDescendant = true;
    it=premises;
    while(it) {
      const Inference& inf = it->head()->inference();
      _inputType = getInputType(_inputType,inf.inputType());
      _isPureTheoryDescendant &= inf.isPureTheoryDescendant();
      _combAxiomsDescendant &= inf.isCombAxiomsDescendant();
      _proxyAxiomsDescendant &= inf.isProxyAxiomsDescendant();
      _holAxiomsDescendant &= inf.isHolAxiomsDescendant();
      _sineLevel = min(_sineLevel,inf.getSineLevel());
      it=it->tail();
    }
  } else {
    _isPureTheoryDescendant = isTheoryAxiom();
    _combAxiomsDescendant = isCombinatorAxiom();
    _proxyAxiomsDescendant = isProxyAxiom();
    _holAxiomsDescendant = _combAxiomsDescendant || _proxyAxiomsDescendant;
  }

  updateStatistics();
}